

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

int Gia_ManCofOneDerive(Ccf_Man_t *p,int LitProp)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int c;
  int LitOut;
  int LitProp_local;
  Ccf_Man_t *p_local;
  
  pVVar1 = p->vCopies;
  iVar2 = Gia_ManObjNum(p->pFrames);
  Vec_IntFill(pVVar1,iVar2,-1);
  iVar2 = Abc_Lit2Var(LitProp);
  Gia_ManCofOneDerive_rec(p,iVar2);
  pVVar1 = p->vCopies;
  iVar2 = Abc_Lit2Var(LitProp);
  iVar2 = Vec_IntEntry(pVVar1,iVar2);
  c = Abc_LitIsCompl(LitProp);
  iVar2 = Abc_LitNotCond(iVar2,c);
  Gia_ManAppendCo(p->pFrames,iVar2);
  Gia_ManCofExtendSolver(p);
  iVar2 = Abc_LitNot(iVar2);
  return iVar2;
}

Assistant:

int Gia_ManCofOneDerive( Ccf_Man_t * p, int LitProp )
{
    int LitOut;
    // derive the cofactor of the property node
    Vec_IntFill( p->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    Gia_ManCofOneDerive_rec( p, Abc_Lit2Var(LitProp) );
    LitOut = Vec_IntEntry( p->vCopies, Abc_Lit2Var(LitProp) );
    LitOut = Abc_LitNotCond( LitOut, Abc_LitIsCompl(LitProp) );
    // add new PO for the cofactor
    Gia_ManAppendCo( p->pFrames, LitOut );
    // add SAT clauses
    Gia_ManCofExtendSolver( p );
    // return negative literal of the cofactor
    return Abc_LitNot(LitOut);
}